

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atomic_unittest.cpp
# Opt level: O3

void __thiscall
AtomicUnitTest_decrement_Test::~AtomicUnitTest_decrement_Test(AtomicUnitTest_decrement_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F(AtomicUnitTest, decrement)
{
    using atomic_int = estl::atomic<int>;
    atomic_int a(10);
    EXPECT_EQ(10, a);
    a--;
    EXPECT_EQ(9, a);

    --a;
    EXPECT_EQ(8, a);

    a -= 5;
    EXPECT_EQ(3, a);
}